

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool c4::atou<unsigned_long>(csubstr str,unsigned_long *v)

{
  char cVar1;
  bool bVar2;
  error_flags eVar3;
  ulong *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  char pfx;
  bool parsed_ok;
  char c_4;
  iterator __end2_4;
  iterator __begin2_4;
  csubstr *__range2_4;
  char c;
  iterator __end2;
  iterator __begin2;
  csubstr *__range2;
  unsigned_long cv;
  char c_1;
  iterator __end2_1;
  iterator __begin2_1;
  csubstr *__range2_1;
  char c_2;
  iterator __end2_2;
  iterator __begin2_2;
  csubstr *__range2_2;
  char c_3;
  iterator __end2_3;
  iterator __begin2_3;
  csubstr *__range2_3;
  bool local_3ca;
  undefined5 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc45;
  undefined1 in_stack_fffffffffffffc46;
  undefined1 in_stack_fffffffffffffc47;
  char *in_stack_fffffffffffffc48;
  undefined6 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc56;
  undefined1 in_stack_fffffffffffffc57;
  bool local_39a;
  bool local_38a;
  bool local_37a;
  bool local_36a;
  bool local_35b;
  bool local_35a;
  bool local_34a;
  bool local_339;
  bool local_2d9;
  char *local_2d0;
  ulong local_2c8;
  bool local_2b9;
  char *local_2b8;
  undefined4 local_2b0;
  undefined8 local_2a8;
  char **local_2a0;
  char *local_298;
  long local_290;
  char *local_288;
  undefined4 local_280;
  undefined8 local_278;
  char **local_270;
  char *local_268;
  long local_260;
  char *local_258;
  undefined4 local_250;
  undefined8 local_248;
  char **local_240;
  char *local_238;
  long local_230;
  char *local_228;
  undefined4 local_220;
  char **local_218;
  char *local_200;
  char *local_1f0;
  undefined4 local_1e8;
  ulong *local_1e0;
  char *local_1d8;
  ulong local_1d0;
  bool local_1c1;
  char **local_1b0;
  char *local_198;
  char *local_188;
  undefined4 local_180;
  ulong *local_178;
  char *local_170;
  ulong local_168;
  bool local_159;
  char **local_148;
  long local_140;
  char *local_128;
  char *local_118;
  undefined4 local_110;
  ulong *local_108;
  char *local_100;
  long local_f8;
  bool local_e9;
  char **local_d8;
  char *local_c0;
  char *local_b0;
  undefined4 local_a8;
  ulong *local_a0;
  char *local_98;
  long local_90;
  bool local_81;
  char **local_70;
  char *local_58;
  char *local_48;
  undefined4 local_40;
  ulong *local_38;
  char *local_30;
  long local_28;
  bool local_19;
  char **local_8;
  
  local_339 = true;
  local_2d0 = in_RDI;
  local_2c8 = in_RSI;
  if (in_RSI != 0) {
    local_218 = &local_2d0;
    if (in_RSI == 0 || in_RDI == (char *)0x0) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      local_228 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_220 = 0x14c6;
      handle_error(0x389522,(char *)0x14c6,"check failed: %s","len > 0 && str != nullptr");
    }
    local_339 = *local_2d0 == '-';
  }
  if (local_339) {
    local_2b9 = false;
  }
  else {
    local_2d9 = true;
    if (*local_2d0 == '0') {
      if (local_2c8 < 2) {
        *in_RDX = 0;
      }
      else {
        cVar1 = local_2d0[1];
        if ((cVar1 == 'x') || (cVar1 == 'X')) {
          local_35b = false;
          if (2 < local_2c8) {
            local_240 = &local_2d0;
            local_248 = 2;
            if (local_2c8 < 2) {
              eVar3 = get_error_flags();
              if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              local_258 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_250 = 0x1533;
              handle_error(0x389522,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
            }
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)
                       CONCAT17(in_stack_fffffffffffffc57,
                                CONCAT16(in_stack_fffffffffffffc56,in_stack_fffffffffffffc50)),
                       in_stack_fffffffffffffc48,
                       CONCAT17(in_stack_fffffffffffffc47,
                                CONCAT16(in_stack_fffffffffffffc46,
                                         CONCAT15(in_stack_fffffffffffffc45,
                                                  in_stack_fffffffffffffc40))));
            local_100 = local_238;
            local_f8 = local_230;
            local_d8 = &local_100;
            local_36a = local_230 == 0 || local_238 == (char *)0x0;
            local_108 = in_RDX;
            if (local_36a) {
              eVar3 = get_error_flags();
              if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              local_118 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_110 = 0x2cac;
              handle_error(0x389522,(char *)0x2cac,"check failed: %s","!s.empty()");
            }
            *local_108 = 0;
            for (local_128 = local_100; local_128 != local_100 + local_f8; local_128 = local_128 + 1
                ) {
              cVar1 = *local_128;
              if ((cVar1 < '0') || ('9' < cVar1)) {
                if ((cVar1 < 'a') || ('f' < cVar1)) {
                  if ((cVar1 < 'A') || ('F' < cVar1)) {
                    local_e9 = false;
                    goto LAB_0035ed67;
                  }
                  local_140 = (long)cVar1 + -0x37;
                }
                else {
                  local_140 = (long)cVar1 + -0x57;
                }
              }
              else {
                local_140 = (long)cVar1 + -0x30;
              }
              *local_108 = *local_108 * 0x10 + local_140;
            }
            local_e9 = true;
LAB_0035ed67:
            local_35b = local_e9;
          }
          local_2d9 = local_35b;
        }
        else if ((cVar1 == 'b') || (cVar1 == 'B')) {
          local_37a = false;
          if (2 < local_2c8) {
            local_270 = &local_2d0;
            local_278 = 2;
            if (local_2c8 < 2) {
              eVar3 = get_error_flags();
              if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              local_288 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_280 = 0x1533;
              handle_error(0x389522,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
            }
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)
                       CONCAT17(in_stack_fffffffffffffc57,
                                CONCAT16(in_stack_fffffffffffffc56,in_stack_fffffffffffffc50)),
                       in_stack_fffffffffffffc48,
                       CONCAT17(in_stack_fffffffffffffc47,
                                CONCAT16(in_stack_fffffffffffffc46,
                                         CONCAT15(in_stack_fffffffffffffc45,
                                                  in_stack_fffffffffffffc40))));
            local_98 = local_268;
            local_90 = local_260;
            local_70 = &local_98;
            local_38a = local_260 == 0 || local_268 == (char *)0x0;
            local_a0 = in_RDX;
            if (local_38a) {
              eVar3 = get_error_flags();
              if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              local_b0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_a8 = 0x2cce;
              handle_error(0x389522,(char *)0x2cce,"check failed: %s","!s.empty()");
            }
            *local_a0 = 0;
            for (local_c0 = local_98; local_c0 != local_98 + local_90; local_c0 = local_c0 + 1) {
              cVar1 = *local_c0;
              *local_a0 = *local_a0 << 1;
              if (cVar1 == '1') {
                *local_a0 = *local_a0 | 1;
              }
              else if (cVar1 != '0') {
                local_81 = false;
                goto LAB_0035f094;
              }
            }
            local_81 = true;
LAB_0035f094:
            local_37a = local_81;
          }
          local_2d9 = local_37a;
        }
        else if ((cVar1 == 'o') || (cVar1 == 'O')) {
          local_39a = false;
          if (2 < local_2c8) {
            local_2a0 = &local_2d0;
            local_2a8 = 2;
            if (local_2c8 < 2) {
              eVar3 = get_error_flags();
              if (((eVar3 & 1) != 0) &&
                 (in_stack_fffffffffffffc57 = is_debugger_attached(),
                 (bool)in_stack_fffffffffffffc57)) {
                trap_instruction();
              }
              local_2b8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_2b0 = 0x1533;
              handle_error(0x389522,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
            }
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)
                       CONCAT17(in_stack_fffffffffffffc57,
                                CONCAT16(in_stack_fffffffffffffc56,in_stack_fffffffffffffc50)),
                       in_stack_fffffffffffffc48,
                       CONCAT17(in_stack_fffffffffffffc47,
                                CONCAT16(in_stack_fffffffffffffc46,
                                         CONCAT15(in_stack_fffffffffffffc45,
                                                  in_stack_fffffffffffffc40))));
            local_30 = local_298;
            local_28 = local_290;
            local_8 = &local_30;
            local_38 = in_RDX;
            if (local_290 == 0 || local_298 == (char *)0x0) {
              eVar3 = get_error_flags();
              if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              local_48 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_40 = 0x2ceb;
              handle_error(0x389522,(char *)0x2ceb,"check failed: %s","!s.empty()");
            }
            *local_38 = 0;
            for (local_58 = local_30; local_58 != local_30 + local_28; local_58 = local_58 + 1) {
              cVar1 = *local_58;
              if (cVar1 < '0' || '7' < cVar1) {
                local_19 = false;
                goto LAB_0035f3dd;
              }
              *local_38 = *local_38 * 8 + (long)cVar1 + -0x30;
            }
            local_19 = true;
LAB_0035f3dd:
            local_39a = local_19;
          }
          local_2d9 = local_39a;
        }
        else {
          local_1d8 = local_2d0;
          local_1d0 = local_2c8;
          local_1b0 = &local_1d8;
          local_1e0 = in_RDX;
          if (local_2c8 == 0 || local_2d0 == (char *)0x0) {
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            local_1f0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_1e8 = 0x2c91;
            handle_error(0x389522,(char *)0x2c91,"check failed: %s","!s.empty()");
          }
          *local_1e0 = 0;
          for (local_200 = local_1d8; local_200 != local_1d8 + local_1d0; local_200 = local_200 + 1)
          {
            cVar1 = *local_200;
            local_3ca = cVar1 < '0' || '9' < cVar1;
            if (local_3ca) {
              local_1c1 = false;
              goto LAB_0035f614;
            }
            *local_1e0 = *local_1e0 * 10 + (long)cVar1 + -0x30;
          }
          local_1c1 = true;
LAB_0035f614:
          local_2d9 = local_1c1;
        }
      }
    }
    else {
      local_170 = local_2d0;
      local_168 = local_2c8;
      local_148 = &local_170;
      local_34a = local_2c8 == 0 || local_2d0 == (char *)0x0;
      local_178 = in_RDX;
      if (local_34a) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        local_188 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_180 = 0x2c91;
        handle_error(0x389522,(char *)0x2c91,"check failed: %s","!s.empty()");
      }
      *local_178 = 0;
      for (local_198 = local_170; local_198 != local_170 + local_168; local_198 = local_198 + 1) {
        cVar1 = *local_198;
        local_35a = cVar1 < '0' || '9' < cVar1;
        if (local_35a) {
          local_159 = false;
          goto LAB_0035e99f;
        }
        *local_178 = *local_178 * 10 + (long)cVar1 + -0x30;
      }
      local_159 = true;
LAB_0035e99f:
      local_2d9 = local_159;
    }
    local_2b9 = local_2d9;
  }
  return local_2b9;
}

Assistant:

bool atou(csubstr str, T * C4_RESTRICT v) noexcept
{
    C4_STATIC_ASSERT(std::is_integral<T>::value);

    if(C4_UNLIKELY(str.len == 0 || str.front() == '-'))
        return false;

    bool parsed_ok = true;
    if(str.str[0] != '0')
    {
        parsed_ok = read_dec(str, v);
    }
    else
    {
        if(str.len > 1)
        {
            const char pfx = str.str[1];
            if(pfx == 'x' || pfx == 'X')
                parsed_ok = str.len > 2 && read_hex(str.sub(2), v);
            else if(pfx == 'b' || pfx == 'B')
                parsed_ok = str.len > 2 && read_bin(str.sub(2), v);
            else if(pfx == 'o' || pfx == 'O')
                parsed_ok = str.len > 2 && read_oct(str.sub(2), v);
            else
                parsed_ok = read_dec(str, v);
        }
        else
        {
            *v = 0; // we know the first character is 0
        }
    }
    return parsed_ok;
}